

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

bool google::protobuf::anon_unknown_6::IsIndexInHasBitSet
               (uint32_t *has_bit_set,uint32_t has_bit_index)

{
  Nullable<const_char_*> failure_msg;
  uint local_24;
  LogMessageFatal local_20;
  
  local_24 = 0xffffffff;
  local_20.super_LogMessage.errno_saver_.saved_errno_ = has_bit_index;
  failure_msg = absl::lts_20250127::log_internal::Check_NEImpl<unsigned_int,unsigned_int>
                          ((uint *)&local_20,&local_24,"has_bit_index != ~0u");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return (has_bit_set[has_bit_index >> 5] >> (has_bit_index & 0x1f) & 1) != 0;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0x6c1,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

bool IsIndexInHasBitSet(const uint32_t* has_bit_set, uint32_t has_bit_index) {
  ABSL_DCHECK_NE(has_bit_index, ~0u);
  return ((has_bit_set[has_bit_index / 32] >> (has_bit_index % 32)) &
          static_cast<uint32_t>(1)) != 0;
}